

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  u8 *puVar1;
  byte bVar2;
  Fts5Config *pConfig;
  u8 *puVar3;
  sqlite3_stmt *pStmt;
  int iVar4;
  i64 iVar5;
  Fts5Data *p_00;
  char *pcVar6;
  Fts5Structure *pFVar7;
  uchar *zKey;
  sqlite3_value *pVal;
  long lVar8;
  sqlite3_stmt *p_1;
  i64 local_68;
  int local_50;
  int local_4c;
  Fts5Structure *local_48;
  sqlite3_stmt *local_40;
  int local_34;
  
  if (p->pStruct != (Fts5Structure *)0x0) goto LAB_001c820c;
  iVar5 = fts5IndexDataVersion(p);
  p->iStructVersion = iVar5;
  if (p->rc != 0) goto LAB_001c820c;
  local_48 = (Fts5Structure *)0x0;
  pConfig = p->pConfig;
  p_00 = fts5DataRead(p,10);
  if (p->rc == 0) {
    puVar3 = p_00->p;
    iVar4 = p_00->nn;
    puVar1 = puVar3 + iVar4;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar3 = puVar3 + (long)iVar4 + 0x10;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    iVar4 = fts5StructureDecode(p_00->p,p_00->nn,&local_50,&local_48);
    p->rc = iVar4;
    if ((iVar4 == 0) && ((pConfig->pgsz == 0 || (pConfig->iCookie != local_50)))) {
      local_40 = (sqlite3_stmt *)0x0;
      local_4c = 0;
      pConfig->pgsz = 0xfd2;
      pConfig->nAutomerge = 4;
      pConfig->nCrisisMerge = 0x10;
      pConfig->nUsermerge = 4;
      pConfig->nHashSize = 0x100000;
      pcVar6 = sqlite3Fts5Mprintf(&local_4c,"SELECT k, v FROM %Q.\'%q_config\'",pConfig->zDb);
      iVar4 = local_4c;
      if (pcVar6 != (char *)0x0) {
        iVar4 = sqlite3LockAndPrepare(pConfig->db,pcVar6,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0)
        ;
        sqlite3_free(pcVar6);
      }
      pStmt = local_40;
      if (iVar4 == 0) {
        iVar4 = sqlite3_step(local_40);
        local_68 = 0;
        if (iVar4 == 100) {
          local_68 = 0;
LAB_001c826e:
          zKey = sqlite3_column_text(pStmt,0);
          pVal = sqlite3_column_value(pStmt,1);
          if (zKey != (uchar *)0x0) {
            lVar8 = 0;
            do {
              bVar2 = zKey[lVar8];
              if (bVar2 == "--version"[lVar8 + 2]) {
                if ((ulong)bVar2 == 0) goto LAB_001c82cb;
              }
              else if (""[bVar2] != ""[(byte)"--version"[lVar8 + 2]]) break;
              lVar8 = lVar8 + 1;
            } while( true );
          }
          sqlite3Fts5ConfigSetValue(pConfig,(char *)zKey,pVal,&local_34);
          goto LAB_001c82d8;
        }
LAB_001c82e5:
        iVar4 = sqlite3_finalize(pStmt);
        if ((iVar4 == 0) && ((int)local_68 != 4)) {
          iVar4 = 1;
          if (pConfig->pzErrmsg != (char **)0x0) {
            pcVar6 = sqlite3_mprintf("invalid fts5 file format (found %d, expected %d) - run \'rebuild\'"
                                     ,local_68,4);
            *pConfig->pzErrmsg = pcVar6;
          }
        }
        else if (iVar4 == 0) {
          pConfig->iCookie = local_50;
          iVar4 = 0;
        }
      }
      p->rc = iVar4;
    }
    sqlite3_free(p_00);
    if (p->rc != 0) {
      fts5StructureRelease(local_48);
      goto LAB_001c8203;
    }
  }
  else {
LAB_001c8203:
    local_48 = (Fts5Structure *)0x0;
  }
  p->pStruct = local_48;
LAB_001c820c:
  if (p->rc == 0) {
    pFVar7 = p->pStruct;
    pFVar7->nRef = pFVar7->nRef + 1;
  }
  else {
    pFVar7 = (Fts5Structure *)0x0;
  }
  return pFVar7;
LAB_001c82cb:
  local_68 = sqlite3VdbeIntValue(pVal);
LAB_001c82d8:
  iVar4 = sqlite3_step(pStmt);
  if (iVar4 != 100) goto LAB_001c82e5;
  goto LAB_001c826e;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}